

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_step(xpath_parser *this,xpath_ast_node *set)

{
  bool bVar1;
  xpath_value_type xVar2;
  lexeme_t lVar3;
  xpath_ast_node *pxVar4;
  xpath_lexer_string *pxVar5;
  xpath_parser *this_00;
  ulong uVar6;
  xpath_parser *value;
  xpath_ast_node *in_RSI;
  xpath_parser *in_RDI;
  xpath_ast_node *pred;
  xpath_ast_node *expr;
  xpath_ast_node *last;
  size_t old_depth;
  xpath_ast_node *n;
  char_t *nt_name_copy;
  xpath_lexer_string nt_name;
  nodetest_t nt_type;
  axis_t axis;
  bool axis_specified;
  bool *in_stack_ffffffffffffff68;
  xpath_parser *in_stack_ffffffffffffff78;
  xpath_ast_node *in_stack_ffffffffffffff80;
  int limit;
  xpath_parser *in_stack_ffffffffffffff88;
  xpath_parser *this_01;
  xpath_ast_node *in_stack_ffffffffffffff90;
  xpath_ast_node *left;
  undefined8 in_stack_ffffffffffffff98;
  ast_type_t type;
  xpath_parser *in_stack_ffffffffffffffa0;
  xpath_lexer_string local_58;
  xpath_lexer_string local_48;
  xpath_lexer_string local_38;
  nodetest_t local_24;
  axis_t local_20;
  byte local_19;
  xpath_ast_node *local_8;
  
  type = (ast_type_t)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if ((in_RSI != (xpath_ast_node *)0x0) &&
     (xVar2 = xpath_ast_node::rettype(in_RSI), xVar2 != xpath_type_node_set)) {
    pxVar4 = error(in_RDI,in_stack_ffffffffffffff68);
    return pxVar4;
  }
  local_19 = 0;
  local_20 = axis_child;
  lVar3 = xpath_lexer::current(&in_RDI->_lexer);
  if (lVar3 == lex_axis_attribute) {
    local_20 = axis_attribute;
    local_19 = 1;
    xpath_lexer::next(&in_RDI->_lexer);
  }
  else {
    lVar3 = xpath_lexer::current(&in_RDI->_lexer);
    if (lVar3 == lex_dot) {
      xpath_lexer::next(&in_RDI->_lexer);
      lVar3 = xpath_lexer::current(&in_RDI->_lexer);
      if (lVar3 == lex_open_square_brace) {
        pxVar4 = error(in_RDI,in_stack_ffffffffffffff68);
        return pxVar4;
      }
      pxVar4 = alloc_node(in_stack_ffffffffffffffa0,type,in_stack_ffffffffffffff90,
                          (axis_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                          (nodetest_t)in_stack_ffffffffffffff88,&in_stack_ffffffffffffff80->_type);
      return pxVar4;
    }
    lVar3 = xpath_lexer::current(&in_RDI->_lexer);
    if (lVar3 == lex_double_dot) {
      xpath_lexer::next(&in_RDI->_lexer);
      lVar3 = xpath_lexer::current(&in_RDI->_lexer);
      if (lVar3 == lex_open_square_brace) {
        pxVar4 = error(in_RDI,in_stack_ffffffffffffff68);
        return pxVar4;
      }
      pxVar4 = alloc_node(in_stack_ffffffffffffffa0,type,in_stack_ffffffffffffff90,
                          (axis_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                          (nodetest_t)in_stack_ffffffffffffff88,&in_stack_ffffffffffffff80->_type);
      return pxVar4;
    }
  }
  local_24 = nodetest_none;
  xpath_lexer_string::xpath_lexer_string(&local_38);
  lVar3 = xpath_lexer::current(&in_RDI->_lexer);
  if (lVar3 == lex_string) {
    pxVar5 = xpath_lexer::contents(&in_RDI->_lexer);
    local_38.begin = pxVar5->begin;
    local_38.end = pxVar5->end;
    xpath_lexer::next(&in_RDI->_lexer);
    lVar3 = xpath_lexer::current(&in_RDI->_lexer);
    if (lVar3 == lex_double_colon) {
      if ((local_19 & 1) != 0) {
        pxVar4 = error(in_RDI,in_stack_ffffffffffffff68);
        return pxVar4;
      }
      local_20 = parse_axis_name(in_stack_ffffffffffffff78,(xpath_lexer_string *)in_RDI,
                                 in_stack_ffffffffffffff68);
      if ((local_19 & 1) == 0) {
        pxVar4 = error(in_RDI,in_stack_ffffffffffffff68);
        return pxVar4;
      }
      xpath_lexer::next(&in_RDI->_lexer);
      lVar3 = xpath_lexer::current(&in_RDI->_lexer);
      if (lVar3 == lex_multiply) {
        local_24 = nodetest_all;
        xpath_lexer_string::xpath_lexer_string(&local_48);
        local_38.begin = local_48.begin;
        local_38.end = local_48.end;
        xpath_lexer::next(&in_RDI->_lexer);
      }
      else {
        lVar3 = xpath_lexer::current(&in_RDI->_lexer);
        if (lVar3 != lex_string) {
          pxVar4 = error(in_RDI,in_stack_ffffffffffffff68);
          return pxVar4;
        }
        pxVar5 = xpath_lexer::contents(&in_RDI->_lexer);
        local_38.begin = pxVar5->begin;
        local_38.end = pxVar5->end;
        xpath_lexer::next(&in_RDI->_lexer);
      }
    }
    if (local_24 == nodetest_none) {
      lVar3 = xpath_lexer::current(&in_RDI->_lexer);
      if (lVar3 == lex_open_brace) {
        xpath_lexer::next(&in_RDI->_lexer);
        lVar3 = xpath_lexer::current(&in_RDI->_lexer);
        if (lVar3 == lex_close_brace) {
          xpath_lexer::next(&in_RDI->_lexer);
          local_24 = parse_node_test_type(in_stack_ffffffffffffff78,(xpath_lexer_string *)in_RDI);
          if (local_24 == nodetest_none) {
            pxVar4 = error(in_RDI,in_stack_ffffffffffffff68);
            return pxVar4;
          }
          xpath_lexer_string::xpath_lexer_string(&local_58);
          local_38.begin = local_58.begin;
          local_38.end = local_58.end;
        }
        else {
          bVar1 = xpath_lexer_string::operator==
                            ((xpath_lexer_string *)in_RDI,in_stack_ffffffffffffff68);
          if (!bVar1) {
            pxVar4 = error(in_RDI,in_stack_ffffffffffffff68);
            return pxVar4;
          }
          lVar3 = xpath_lexer::current(&in_RDI->_lexer);
          if (lVar3 != lex_quoted_string) {
            pxVar4 = error(in_RDI,in_stack_ffffffffffffff68);
            return pxVar4;
          }
          local_24 = nodetest_pi;
          pxVar5 = xpath_lexer::contents(&in_RDI->_lexer);
          local_38.begin = pxVar5->begin;
          local_38.end = pxVar5->end;
          xpath_lexer::next(&in_RDI->_lexer);
          lVar3 = xpath_lexer::current(&in_RDI->_lexer);
          if (lVar3 != lex_close_brace) {
            pxVar4 = error(in_RDI,in_stack_ffffffffffffff68);
            return pxVar4;
          }
          xpath_lexer::next(&in_RDI->_lexer);
        }
      }
      else if ((((long)local_38.end - (long)local_38.begin < 3) || (local_38.end[-2] != ':')) ||
              (local_38.end[-1] != '*')) {
        local_24 = nodetest_name;
      }
      else {
        local_38.end = local_38.end + -1;
        local_24 = nodetest_all_in_namespace;
      }
    }
  }
  else {
    lVar3 = xpath_lexer::current(&in_RDI->_lexer);
    if (lVar3 != lex_multiply) {
      pxVar4 = error(in_RDI,in_stack_ffffffffffffff68);
      return pxVar4;
    }
    local_24 = nodetest_all;
    xpath_lexer::next(&in_RDI->_lexer);
  }
  this_00 = (xpath_parser *)
            alloc_string(in_stack_ffffffffffffff88,(xpath_lexer_string *)in_stack_ffffffffffffff80);
  if (this_00 == (xpath_parser *)0x0) {
    local_8 = (xpath_ast_node *)0x0;
  }
  else {
    pxVar4 = alloc_node(this_00,type,in_stack_ffffffffffffff90,
                        (axis_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                        (nodetest_t)in_stack_ffffffffffffff88,&in_stack_ffffffffffffff80->_type);
    if (pxVar4 == (xpath_ast_node *)0x0) {
      local_8 = (xpath_ast_node *)0x0;
    }
    else {
      left = (xpath_ast_node *)in_RDI->_depth;
      this_01 = (xpath_parser *)0x0;
      while( true ) {
        limit = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
        lVar3 = xpath_lexer::current(&in_RDI->_lexer);
        if (lVar3 != lex_open_square_brace) break;
        xpath_lexer::next(&in_RDI->_lexer);
        uVar6 = in_RDI->_depth + 1;
        in_RDI->_depth = uVar6;
        if (0x400 < uVar6) {
          pxVar4 = error_rec((xpath_parser *)0x162e47);
          return pxVar4;
        }
        in_stack_ffffffffffffff80 = parse_expression(this_01,limit);
        if (in_stack_ffffffffffffff80 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        value = (xpath_parser *)
                alloc_node(this_00,(ast_type_t)((ulong)pxVar4 >> 0x20),left,
                           (xpath_ast_node *)this_01,
                           (predicate_t)((ulong)in_stack_ffffffffffffff80 >> 0x20));
        if (value == (xpath_parser *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        lVar3 = xpath_lexer::current(&in_RDI->_lexer);
        if (lVar3 != lex_close_square_brace) {
          pxVar4 = error(in_RDI,in_stack_ffffffffffffff68);
          return pxVar4;
        }
        xpath_lexer::next(&in_RDI->_lexer);
        if (this_01 == (xpath_parser *)0x0) {
          xpath_ast_node::set_right(pxVar4,(xpath_ast_node *)value);
          this_01 = value;
        }
        else {
          xpath_ast_node::set_next((xpath_ast_node *)this_01,(xpath_ast_node *)value);
          this_01 = value;
        }
      }
      in_RDI->_depth = (size_t)left;
      local_8 = pxVar4;
    }
  }
  return local_8;
}

Assistant:

xpath_ast_node* parse_step(xpath_ast_node* set)
		{
			if (set && set->rettype() != xpath_type_node_set)
				return error("Step has to be applied to node set");

			bool axis_specified = false;
			axis_t axis = axis_child; // implied child axis

			if (_lexer.current() == lex_axis_attribute)
			{
				axis = axis_attribute;
				axis_specified = true;

				_lexer.next();
			}
			else if (_lexer.current() == lex_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_self, nodetest_type_node, NULL);
			}
			else if (_lexer.current() == lex_double_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_parent, nodetest_type_node, NULL);
			}

			nodetest_t nt_type = nodetest_none;
			xpath_lexer_string nt_name;

			if (_lexer.current() == lex_string)
			{
				// node name test
				nt_name = _lexer.contents();
				_lexer.next();

				// was it an axis name?
				if (_lexer.current() == lex_double_colon)
				{
					// parse axis name
					if (axis_specified)
						return error("Two axis specifiers in one step");

					axis = parse_axis_name(nt_name, axis_specified);

					if (!axis_specified)
						return error("Unknown axis");

					// read actual node test
					_lexer.next();

					if (_lexer.current() == lex_multiply)
					{
						nt_type = nodetest_all;
						nt_name = xpath_lexer_string();
						_lexer.next();
					}
					else if (_lexer.current() == lex_string)
					{
						nt_name = _lexer.contents();
						_lexer.next();
					}
					else
					{
						return error("Unrecognized node test");
					}
				}

				if (nt_type == nodetest_none)
				{
					// node type test or processing-instruction
					if (_lexer.current() == lex_open_brace)
					{
						_lexer.next();

						if (_lexer.current() == lex_close_brace)
						{
							_lexer.next();

							nt_type = parse_node_test_type(nt_name);

							if (nt_type == nodetest_none)
								return error("Unrecognized node type");

							nt_name = xpath_lexer_string();
						}
						else if (nt_name == PUGIXML_TEXT("processing-instruction"))
						{
							if (_lexer.current() != lex_quoted_string)
								return error("Only literals are allowed as arguments to processing-instruction()");

							nt_type = nodetest_pi;
							nt_name = _lexer.contents();
							_lexer.next();

							if (_lexer.current() != lex_close_brace)
								return error("Unmatched brace near processing-instruction()");
							_lexer.next();
						}
						else
						{
							return error("Unmatched brace near node type test");
						}
					}
					// QName or NCName:*
					else
					{
						if (nt_name.end - nt_name.begin > 2 && nt_name.end[-2] == ':' && nt_name.end[-1] == '*') // NCName:*
						{
							nt_name.end--; // erase *

							nt_type = nodetest_all_in_namespace;
						}
						else
						{
							nt_type = nodetest_name;
						}
					}
				}
			}
			else if (_lexer.current() == lex_multiply)
			{
				nt_type = nodetest_all;
				_lexer.next();
			}
			else
			{
				return error("Unrecognized node test");
			}

			const char_t* nt_name_copy = alloc_string(nt_name);
			if (!nt_name_copy) return NULL;

			xpath_ast_node* n = alloc_node(ast_step, set, axis, nt_type, nt_name_copy);
			if (!n) return NULL;

			size_t old_depth = _depth;

			xpath_ast_node* last = NULL;

			while (_lexer.current() == lex_open_square_brace)
			{
				_lexer.next();

				if (++_depth > xpath_ast_depth_limit)
					return error_rec();

				xpath_ast_node* expr = parse_expression();
				if (!expr) return NULL;

				xpath_ast_node* pred = alloc_node(ast_predicate, NULL, expr, predicate_default);
				if (!pred) return NULL;

				if (_lexer.current() != lex_close_square_brace)
					return error("Expected ']' to match an opening '['");
				_lexer.next();

				if (last) last->set_next(pred);
				else n->set_right(pred);

				last = pred;
			}

			_depth = old_depth;

			return n;
		}